

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1,_-1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1,__1,_false,_true>
                  *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *xpr,Index i)

{
  PointerType pdVar1;
  long lVar2;
  long lVar3;
  XprTypeNested pMVar4;
  long lVar5;
  
  MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_1,_-1,_false>,_0>
  ::MapBase(&this->
             super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1,__1,_false>,_0>
            ,(xpr->
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
             m_data + i,1,
            (xpr->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
            m_cols.m_value);
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_outerStride
       = (xpr->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>
         ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
         m_outerStride;
  pdVar1 = (xpr->
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
           m_data;
  lVar2 = (xpr->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
          m_rows.m_value;
  lVar3 = (xpr->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.
          m_cols.m_value;
  pMVar4 = (xpr->
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_xpr
  ;
  lVar5 = (xpr->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
          m_startCol.m_value;
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_startRow.
  m_value = (xpr->
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
            m_startRow.m_value;
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_startCol.
  m_value = lVar5;
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.m_cols.
  m_value = lVar3;
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.m_xpr = pMVar4
  ;
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.m_data =
       pdVar1;
  (this->m_xpr).
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,_0>.m_rows.
  m_value = lVar2;
  (this->m_startRow).m_value = i;
  (this->m_startCol).m_value = 0;
  this->m_outerStride = 1;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }